

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O2

void __thiscall
Fade::run(Fade *this,FadeAggregates *finalAggregates,
         vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
         *aggregateRegister,int *numberOfAggregatesPerNode,int *degreeOfLocalAggregates,
         bool *_onehotfeatures,bool *isDetermined,int *determinedBy)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  int *piVar4;
  Database pTVar5;
  FadeAttributes *pFVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int *piVar10;
  int **ppiVar11;
  DTreeNode *pDVar12;
  ulong *puVar13;
  pointer pdVar14;
  int *piVar15;
  pointer *pppdVar16;
  int *__dest;
  DataType *__s;
  ulong *puVar17;
  _Rb_tree_node_base *p_Var18;
  ostream *poVar19;
  ulong uVar20;
  uint fWorker;
  uint uVar21;
  ulong uVar22;
  size_t attID;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  uint partition;
  thread *this_00;
  int numCatParts;
  int iVar32;
  long lVar33;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>,_bool>
  pVar34;
  allocator_type local_81;
  long local_80;
  pointer local_78;
  ulong local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aggs;
  vector<int_*,_std::allocator<int_*>_> offs;
  
  local_80 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _root->_id;
  this->_numberOfAggregatesPerNode = numberOfAggregatesPerNode;
  this->_degreeOfLocalAggregates = degreeOfLocalAggregates;
  this->_onehotfeatures = _onehotfeatures;
  this->isDetermined = isDetermined;
  this->determinedBy = determinedBy;
  uVar22 = _NUM_OF_ATTRIBUTES;
  uVar23 = ((long)numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 4 + -1]) * 4;
  if ((int)((long)numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 4 + -1]) < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar23);
  this->_degreeOfCategoricalAggregateGroup = piVar10;
  this->_numberOfValues = 0;
  ppiVar11 = (int **)operator_new__(-(ulong)(uVar22 >> 0x3d != 0) | uVar22 * 8);
  this->_aggregateRegister = ppiVar11;
  for (uVar23 = 0; uVar23 < uVar22; uVar23 = uVar23 + 1) {
    pDVar12 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,(int)uVar23);
    uVar22 = _NUM_OF_ATTRIBUTES;
    lVar27 = (long)pDVar12->_numOfChildren + 2;
    lVar33 = (long)pDVar12->_numOfChildren + 3;
    iVar9 = (this->_numberOfAggregatesPerNode + uVar23)[_NUM_OF_ATTRIBUTES * 2] * (int)lVar33 +
            this->_numberOfAggregatesPerNode[uVar23] * (int)lVar27;
    uVar20 = (long)iVar9 * 4;
    if (iVar9 < 0) {
      uVar20 = 0xffffffffffffffff;
    }
    piVar10 = (int *)operator_new__(uVar20);
    this->_aggregateRegister[uVar23] = piVar10;
    piVar10 = this->_numberOfAggregatesPerNode;
    piVar15 = this->_aggregateRegister[uVar23];
    iVar9 = 0;
    for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
      pvVar3 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (lVar29 = 0; lVar29 < piVar10[uVar23]; lVar29 = lVar29 + 1) {
        piVar15[iVar9 + lVar29] =
             *(int *)(*(long *)(*(long *)&pvVar3[uVar23].
                                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                          super__Vector_impl_data + lVar29 * 8) + lVar26 * 4);
      }
      iVar9 = iVar9 + (int)lVar29;
    }
    for (lVar26 = 0; lVar26 < piVar10[uVar23]; lVar26 = lVar26 + 1) {
      pvVar3 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar30 = (long)iVar9;
      for (lVar29 = 2; lVar29 < lVar27; lVar29 = lVar29 + 1) {
        piVar15[lVar30 + lVar29 + -2] =
             *(int *)(*(long *)(*(long *)&pvVar3[uVar23].
                                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                          super__Vector_impl_data + lVar26 * 8) + lVar29 * 4);
        iVar9 = iVar9 + 1;
      }
    }
    for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
      pvVar3 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (lVar26 = 0; (int)lVar26 < numberOfAggregatesPerNode[uVar22 * 2 + uVar23];
          lVar26 = lVar26 + 1) {
        piVar15[iVar9 + lVar26] =
             *(int *)(*(long *)(*(long *)&pvVar3[uVar23].
                                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                          super__Vector_impl_data + (piVar10[uVar23] + lVar26) * 8)
                     + lVar27 * 4);
      }
      iVar9 = iVar9 + (int)lVar26;
    }
    for (iVar25 = 0; iVar25 < piVar10[uVar22 * 2 + uVar23]; iVar25 = iVar25 + 1) {
      pvVar3 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar26 = (long)iVar9;
      for (lVar27 = 2; lVar27 < lVar33; lVar27 = lVar27 + 1) {
        piVar15[lVar26 + lVar27 + -2] =
             *(int *)(*(long *)(*(long *)&pvVar3[uVar23].
                                          super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                          super__Vector_impl_data +
                               ((long)iVar25 + (long)piVar10[uVar23]) * 8) + lVar27 * 4);
        iVar9 = iVar9 + 1;
      }
    }
  }
  uVar22 = uVar22 & 0xffffffff;
  while( true ) {
    uVar23 = dfdb::params::NUM_OF_TABLES;
    uVar22 = uVar22 - 1;
    uVar21 = (uint)uVar22;
    if ((int)uVar21 < 0) break;
    pDVar12 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,uVar21);
    uVar1 = pDVar12->_numOfChildren;
    pDVar12 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,uVar21);
    uVar23 = _NUM_OF_ATTRIBUTES;
    piVar10 = pDVar12->_childrenIDs;
    piVar15 = this->_numberOfAggregatesPerNode;
    uVar20 = (ulong)(uVar21 & 0x7fffffff);
    iVar9 = piVar15[_NUM_OF_ATTRIBUTES * 3 + uVar20];
    iVar25 = piVar15[uVar20];
    local_70 = uVar20 * 0x18;
    local_78 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar20;
    uVar31 = 0;
    if (0 < (int)uVar1) {
      uVar31 = (ulong)uVar1;
    }
    uVar21 = (piVar15 + uVar20)[_NUM_OF_ATTRIBUTES * 2];
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    piVar4 = this->_degreeOfCategoricalAggregateGroup;
    for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
      lVar27 = (long)iVar25 + uVar24;
      iVar32 = 0;
      for (uVar28 = 0; uVar31 != uVar28; uVar28 = uVar28 + 1) {
        iVar2 = *(int *)(*(long *)(*(long *)&(aggregateRegister->
                                             super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar20].
                                             super__Vector_base<int_*,_std::allocator<int_*>_>.
                                             _M_impl.super__Vector_impl_data + lVar27 * 8) + 8 +
                        uVar28 * 4);
        if (piVar15[piVar10[uVar28]] <= iVar2) {
          iVar32 = iVar32 + this->_degreeOfCategoricalAggregateGroup
                            [(iVar2 - piVar15[piVar10[uVar28]]) +
                             piVar15[uVar23 * 3 + (long)piVar10[uVar28]]];
        }
      }
      piVar4[(long)iVar9 + uVar24] =
           iVar32 + (uint)(*(int *)(*(long *)(*(long *)&(local_78->
                                                                                                                
                                                  super__Vector_base<int_*,_std::allocator<int_*>_>)
                                                  ._M_impl.super__Vector_impl_data + lVar27 * 8) + 8
                                   + (long)(int)uVar1 * 4) == 1);
    }
  }
  uVar22 = (ulong)this->_numOfThreads;
  if (uVar22 < 2) {
    uVar22 = -(ulong)(dfdb::params::NUM_OF_TABLES >> 0x3e != 0) | dfdb::params::NUM_OF_TABLES * 4;
    piVar10 = (int *)operator_new__(uVar22);
    piVar15 = (int *)operator_new__(uVar22);
    pppdVar16 = &(this->_data->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
    for (uVar22 = 0; uVar23 != uVar22; uVar22 = uVar22 + 1) {
      piVar10[uVar22] = 0;
      piVar15[uVar22] =
           (int)((ulong)((long)*pppdVar16 - (long)((_Vector_impl_data *)(pppdVar16 + -1))->_M_start)
                >> 3) + -1;
      pppdVar16 = pppdVar16 + 3;
    }
    runAggregator(this,piVar10,piVar15,0);
    lVar27 = local_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&finalAggregates->categoricalAggregates,
               this->_aggregatesPerPartition->categoricalAggregates + local_80);
    uVar22 = _NUM_OF_ATTRIBUTES;
    piVar4 = this->_numberOfAggregatesPerNode;
    lVar27 = (long)piVar4[_NUM_OF_ATTRIBUTES * 2 + lVar27];
    if (0 < lVar27) {
      uVar23 = lVar27 << 2;
      __dest = (int *)operator_new__(uVar23);
      finalAggregates->categoricalOffsets = __dest;
      memcpy(__dest,this->_aggregatesPerPartition->categoricalOffsets +
                    piVar4[uVar22 * 3 + local_80],uVar23);
    }
    operator_delete__(piVar10);
    operator_delete__(piVar15);
    lVar27 = local_80;
  }
  else {
    puVar13 = (ulong *)operator_new__(uVar22 * 8 + 8);
    *puVar13 = uVar22;
    this_00 = (thread *)(puVar13 + 1);
    memset(this_00,0,uVar22 * 8);
    pdVar14 = (pointer)getTableToPartition(this);
    pTVar5 = this->_data;
    for (uVar22 = 0; uVar23 = (ulong)this->_numOfThreads, uVar22 < uVar23; uVar22 = uVar22 + 1) {
      offs.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      aggs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
      ((aggs.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR___State_00152ca8;
      ((aggs.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
           = (pointer)this;
      ((aggs.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)pTVar5;
      aggs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           pdVar14;
      std::thread::_M_start_thread(&offs,&aggs,0);
      if (aggs.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((aggs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[1])();
      }
      std::thread::operator=(this_00,(thread *)&offs);
      std::thread::~thread((thread *)&offs);
      this_00 = this_00 + 1;
    }
    for (uVar22 = 0; uVar22 < uVar23; uVar22 = uVar22 + 1) {
      std::thread::join();
      uVar23 = (ulong)this->_numOfThreads;
    }
    if (*puVar13 != 0) {
      lVar27 = *puVar13 << 3;
      do {
        std::thread::~thread((thread *)((long)puVar13 + lVar27));
        lVar27 = lVar27 + -8;
      } while (lVar27 != 0);
    }
    operator_delete__(puVar13);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&aggs,(ulong)this->_numOfPartitions,(allocator_type *)&offs);
    std::vector<int_*,_std::allocator<int_*>_>::vector
              (&offs,(ulong)this->_numOfPartitions,&local_81);
    lVar33 = 0;
    lVar26 = local_80 * 0x18;
    lVar29 = 0;
    for (uVar22 = 0; lVar27 = local_80, uVar22 < this->_numOfPartitions; uVar22 = uVar22 + 1) {
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((aggs.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar33),
                 (vector<double,_std::allocator<double>_> *)
                 (*(long *)((long)&this->_aggregatesPerPartition->categoricalAggregates + lVar29) +
                 lVar26));
      offs.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar22] =
           *(int **)((long)&this->_aggregatesPerPartition->categoricalOffsets + lVar29);
      lVar29 = lVar29 + 0x88;
      lVar33 = lVar33 + 0x18;
    }
    uVar22 = (long)this->_numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 2 + local_80] * 4;
    if ((long)this->_numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 2 + local_80] < 0) {
      uVar22 = 0xffffffffffffffff;
    }
    piVar10 = (int *)operator_new__(uVar22);
    finalAggregates->categoricalOffsets = piVar10;
    mergeCategoricalValues(this,&finalAggregates->categoricalAggregates,piVar10,&aggs,&offs);
    std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
              (&offs.super__Vector_base<int_*,_std::allocator<int_*>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&aggs);
  }
  uVar22 = _NUM_OF_ATTRIBUTES;
  uVar21 = (this->_numberOfAggregatesPerNode + lVar27)[_NUM_OF_ATTRIBUTES];
  uVar20 = (ulong)this->_numOfPartitions;
  uVar1 = this->_numberOfAggregatesPerNode[lVar27];
  uVar23 = (long)(int)uVar1 * 8;
  if ((long)(int)uVar1 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  __s = (DataType *)operator_new__(uVar23);
  uVar31 = 0;
  memset(__s,0,uVar23);
  pFVar6 = this->_aggregatesPerPartition;
  uVar23 = 0;
  if (0 < (int)uVar1) {
    uVar23 = (ulong)uVar1;
  }
  for (; uVar31 != uVar20; uVar31 = uVar31 + 1) {
    for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
      __s[uVar24] = pFVar6[uVar31].aggregates[(long)(int)uVar21 + uVar24] + __s[uVar24];
    }
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar22;
  finalAggregates->aggregates = __s;
  uVar23 = SUB168(auVar7 * ZEXT816(0x30),0) | 8;
  if (SUB168(auVar7 * ZEXT816(0x30),8) != 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar23);
  *puVar13 = uVar22;
  if (uVar22 != 0) {
    puVar17 = puVar13 + 2;
    lVar27 = uVar22 * 0x30;
    do {
      *(undefined4 *)puVar17 = 0;
      puVar17[1] = 0;
      puVar17[2] = (ulong)puVar17;
      puVar17[3] = (ulong)puVar17;
      puVar17[4] = 0;
      puVar17 = puVar17 + 6;
      lVar27 = lVar27 + -0x30;
    } while (lVar27 != 0);
  }
  finalAggregates->functionalDependencies =
       (map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
        *)(puVar13 + 1);
  iVar9 = determinedBy[uVar22];
  uVar31 = (ulong)iVar9;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar31;
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x30),8) == 0) {
    uVar23 = SUB168(auVar8 * ZEXT816(0x30),0) | 8;
  }
  puVar13 = (ulong *)operator_new__(uVar23);
  *puVar13 = uVar31;
  if (uVar31 == 0) {
    finalAggregates->determinantValueSet =
         (set<double,_std::less<double>,_std::allocator<double>_> *)(puVar13 + 1);
  }
  else {
    puVar17 = puVar13 + 2;
    lVar27 = uVar31 * 0x30;
    do {
      *(undefined4 *)puVar17 = 0;
      puVar17[1] = 0;
      puVar17[2] = (ulong)puVar17;
      puVar17[3] = (ulong)puVar17;
      puVar17[4] = 0;
      puVar17 = puVar17 + 6;
      lVar27 = lVar27 + -0x30;
    } while (lVar27 != 0);
    finalAggregates->determinantValueSet =
         (set<double,_std::less<double>,_std::allocator<double>_> *)(puVar13 + 1);
    if (0 < iVar9) {
      for (uVar23 = 0; uVar23 < uVar20; uVar23 = uVar23 + 1) {
        local_78 = (pointer)(uVar23 * 0x88);
        local_70 = uVar23;
        for (uVar20 = 0; uVar20 < uVar22; uVar20 = uVar20 + 1) {
          if (isDetermined[uVar20] == true) {
            iVar9 = determinedBy[uVar20];
            lVar27 = *(long *)((long)&this->_aggregatesPerPartition->functionalDependencies +
                              (long)local_78) + uVar20 * 0x30;
            for (p_Var18 = *(_Rb_tree_node_base **)(lVar27 + 0x18); uVar23 = local_70,
                uVar22 = _NUM_OF_ATTRIBUTES, p_Var18 != (_Rb_tree_node_base *)(lVar27 + 8);
                p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
              std::
              _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                        ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                          *)(finalAggregates->determinantValueSet + determinedBy[iVar9]),
                         *(_Base_ptr *)(p_Var18 + 2),
                         (_Rb_tree_const_iterator<double>)&p_Var18[1]._M_left);
              pVar34 = std::
                       _Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                       ::
                       _M_emplace_unique<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>&>
                                 ((_Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                                   *)(finalAggregates->functionalDependencies + uVar20),
                                  (pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                                   *)(p_Var18 + 1));
              if (((undefined1  [16])pVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::
                _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                          ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                            *)&pVar34.first._M_node._M_node[1]._M_parent,*(_Base_ptr *)(p_Var18 + 2)
                           ,(_Rb_tree_const_iterator<double>)&p_Var18[1]._M_left);
              }
            }
          }
        }
        uVar20 = (ulong)this->_numOfPartitions;
      }
    }
  }
  poVar19 = std::operator<<((ostream *)&std::cout,
                            "DATA - Number of values in Factorised Representation: ");
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::operator<<(poVar19,"\n");
  poVar19 = std::operator<<((ostream *)&std::cout,
                            "DATA - Number of values in Listing Representation: ");
  poVar19 = std::ostream::_M_insert<long>((long)poVar19);
  std::endl<char,std::char_traits<char>>(poVar19);
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::operator<<((ostream *)&std::cout,"DATA - Compression Factor: ");
  poVar19 = std::ostream::_M_insert<double>
                      (((((double)CONCAT44(0x45300000,(int)(_NUM_OF_ATTRIBUTES >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)_NUM_OF_ATTRIBUTES) - 4503599627370496.0))
                       * *finalAggregates->aggregates) / (double)this->_numberOfValues);
  std::endl<char,std::char_traits<char>>(poVar19);
  return;
}

Assistant:

void Fade::run(
    FadeAggregates& finalAggregates, std::vector<std::vector<int*> >& aggregateRegister,
    int* numberOfAggregatesPerNode, int* degreeOfLocalAggregates, bool* _onehotfeatures,
    bool* isDetermined, int* determinedBy)
{
    int rootID = _dTree->_root->_id;
    
    _numberOfAggregatesPerNode = numberOfAggregatesPerNode;
    _degreeOfLocalAggregates = degreeOfLocalAggregates;

    this->_onehotfeatures = _onehotfeatures;
    this->isDetermined = isDetermined; 
    this->determinedBy = determinedBy; 

    _degreeOfCategoricalAggregateGroup =
        new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 4 - 1] +
                _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 - 1]];
    
    _numberOfValues = 0;
    
    /*
     * _aggregateRegister is used as a performance improvement for better
     * accessing of aggregateInfoPerNode
     */
    _aggregateRegister = new int*[NUM_OF_ATTRIBUTES];

    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES; ++attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;

        int totalNumberOfAggregates =
            _numberOfAggregatesPerNode[attID] * (childCount + 2) +
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID] *
            (childCount + 3);

        _aggregateRegister[attID] = new int[totalNumberOfAggregates];

        int *info = _aggregateRegister[attID];
        int index = 0;

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
        {
            for (int j = 2; j < childCount + 2; ++j)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i <
                     numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }

        for (int i = 0; i <
                 _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
        {
            for (int j = 2; j < childCount + 3; ++j)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }
    }

        
    for (int attID = NUM_OF_ATTRIBUTES - 1; attID >= 0; --attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;
        int *childIDs = _dTree->getNode(attID)->_childrenIDs;
        int catAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID];

        int numberOfContAggregates = _numberOfAggregatesPerNode[attID];
        int numberOfCatAggregates =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES*2 + attID];

        for (int catAggNo = 0; catAggNo < numberOfCatAggregates; ++catAggNo)
        {
            int numCatParts = 0;
            for (int child = 0; child < childCount; ++child)
            {
                if (aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] >=
                    _numberOfAggregatesPerNode[childIDs[child]])
                {

                    numCatParts +=
                        _degreeOfCategoricalAggregateGroup[
                            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + childIDs[child]] +
                            aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] -
                            _numberOfAggregatesPerNode[childIDs[child]]];
                }
            }

            if (aggregateRegister[attID][numberOfContAggregates + catAggNo][childCount + 2] == 1)
                numCatParts += 1;

            _degreeOfCategoricalAggregateGroup[catAggOffset + catAggNo] = numCatParts;
        }
    }
    
    /* Spawn threads and do partitioning. */
    if (_numOfThreads > 1)
    {
        /* Array containing threads to run F on different partitions. */
        thread* fWorkers = new thread[_numOfThreads];

        /* Table to partition (only one table is partitioned to guarantee join
         * correctness). */
        size_t tableToPartition = getTableToPartition();

        DINFO(
            "INFO - engine: launching " + to_string(_numOfThreads)
            + " threads to process " + to_string(_numOfPartitions)
            + " partitions on table " + to_string(tableToPartition)
            + ".\n");

        /* This is needed for the lambda expression below - does not accept a
         * variable that is out of scope. */
        Database dataToProcess = _data;
        
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker] =
                thread(
                    [this, dataToProcess, tableToPartition]()
                    {
                        /* Current partition to work on; increase value for next
                         * thread to fetch. */
                        unsigned int currentPartition =
                        _nextPartition.fetch_add(1, memory_order_relaxed);

                        /* Iterate while not all the partitions were processed. */
                        while (currentPartition < _numOfPartitions)
                        {
                            /* Set bounds for the different tables. */
                            int* lowerBounds = new int[NUM_OF_TABLES];
                            int* upperBounds = new int[NUM_OF_TABLES];
                            for (size_t table = 0; table < NUM_OF_TABLES; ++table)
                            {
                                /* This is not a table to partition; it will be
                                 * fully processed. */
                                if(table != tableToPartition)
                                {
                                    lowerBounds[table] = 0;
                                    upperBounds[table] = _data[table].size() - 1;
                                }
                                /* Table to partition; define bounds based on
                                 * current partition number. */
                                else
                                {
                                    lowerBounds[table] = (int)(_data[table].size() * ((double) currentPartition/_numOfPartitions));
                                    upperBounds[table] = (int)(_data[table].size() * ((double) (currentPartition+1)/_numOfPartitions)) - 1;
                                }

                            }


                            /* Launch Fade to compute Aggregates. */
                            runAggregator(lowerBounds, upperBounds, currentPartition);

                            /* Retrieve and increase value of current partition
                             * to work on. */
                            currentPartition = _nextPartition.fetch_add(1, memory_order_relaxed);

                            /* Clean up bound arrays. */
                            delete[] lowerBounds;
                            delete[] upperBounds;
                        }
                    });
        }

        /* Wait for all threads to finish their tasks. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker].join();
        }

        /* Delete array of threads. */
        delete[] fWorkers;

        vector<vector<double> > aggs(_numOfPartitions);
        vector<int*> offs(_numOfPartitions);
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            aggs[partition] = _aggregatesPerPartition[partition].categoricalAggregates[rootID];			
            offs[partition] = _aggregatesPerPartition[partition].categoricalOffsets;
        }

        finalAggregates.categoricalOffsets =
            new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID]];
        
        mergeCategoricalValues(finalAggregates.categoricalAggregates,
                               finalAggregates.categoricalOffsets, aggs, offs);
    }
    else
    {
        /* Set bounds for the different tables: they cover the whole tables */
        int* lowerBounds = new int[NUM_OF_TABLES];
        int* upperBounds = new int[NUM_OF_TABLES];
        for (size_t table = 0; table < NUM_OF_TABLES; ++table)
        {
            lowerBounds[table] = 0;
            upperBounds[table] = _data[table].size() - 1;
        }

        /* Launch Fade to compute Aggregates. */
        runAggregator(lowerBounds, upperBounds, 0);

        /* Retrieving the final categorical aggregates. */
        finalAggregates.categoricalAggregates =
            _aggregatesPerPartition[0].categoricalAggregates[rootID];

        /* Retrieving the final number of categorical aggregate groups. */
        int numCatAggs = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];

        /* Retrieving the final offsets for each categorical aggregate group. */
        if (numCatAggs > 0)
        {
            finalAggregates.categoricalOffsets = new int[numCatAggs];
            memcpy(finalAggregates.categoricalOffsets,
                   &_aggregatesPerPartition[0].categoricalOffsets[
                       _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID]],
                   sizeof(int) * numCatAggs);
        }

        /* Clean up bound arrays. */
        delete[] lowerBounds;
        delete[] upperBounds;
    }

    int aggregateOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + rootID];

    double numOfTuples = 0.0; 
    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        numOfTuples += _aggregatesPerPartition[partition].aggregates[0];
    }

    /* Retrieve the aggregates from all the partitions and sum them up. */
    double* finalContinuousAggregates =
        new double[_numberOfAggregatesPerNode[rootID]]();

    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        for (int aggregateNo = 0; aggregateNo <
                 _numberOfAggregatesPerNode[rootID]; ++aggregateNo)
            finalContinuousAggregates[aggregateNo] +=
                _aggregatesPerPartition[partition].aggregates[aggregateOffset + aggregateNo];
    }

    finalAggregates.aggregates = finalContinuousAggregates;


    finalAggregates.functionalDependencies = new map<double, set<double>>[NUM_OF_ATTRIBUTES];

    int numOfFDs = determinedBy[NUM_OF_ATTRIBUTES];
    finalAggregates.determinantValueSet = new set<double>[numOfFDs];

    if(numOfFDs > 0)
    {
        /* We combine the FDs from different partitions & collect the set of determinant values. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
            {
                if (isDetermined[i])
                {
                    int determinantID = determinedBy[i];
                    for (auto& p : _aggregatesPerPartition[partition].functionalDependencies[i])
                    {
                        finalAggregates.determinantValueSet[determinedBy[determinantID]].insert(p.second.begin(), p.second.end());

                        auto insertPair = finalAggregates.functionalDependencies[i].insert(p);
                        if (!insertPair.second)
                            insertPair.first->second.insert(p.second.begin(), p.second.end());
                    }
                }
            }
        }
    }

    std::cout << "DATA - Number of values in Factorised Representation: " << _numberOfValues << "\n";
    std::cout << "DATA - Number of values in Listing Representation: " <<
        long(finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) << std::endl;
    std::cout << std::fixed << "DATA - Compression Factor: "
              << (finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) / _numberOfValues
              << std::endl;   
}